

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

void calc_output_hex(SINC_FILTER *filter,int channels,increment_t increment,
                    increment_t start_filter_index,double scale,float *output)

{
  float fVar1;
  float fVar2;
  float fVar3;
  increment_t iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  int local_c4;
  int local_c0;
  int ch_2;
  int ch_1;
  int ch;
  int steps;
  int indx;
  int coeff_count;
  int data_index;
  increment_t max_filter_index;
  increment_t filter_index;
  double icoeff;
  double right [6];
  double left [6];
  double fraction;
  float *output_local;
  double scale_local;
  increment_t start_filter_index_local;
  increment_t increment_local;
  int channels_local;
  SINC_FILTER *filter_local;
  
  iVar4 = int_to_fp(filter->coeff_half_len);
  iVar5 = (iVar4 - start_filter_index) / increment;
  data_index = start_filter_index + iVar5 * increment;
  indx = filter->b_current - channels * iVar5;
  if (indx < 0) {
    iVar5 = int_div_ceil(-indx,6);
    iVar6 = int_div_ceil(data_index,increment);
    if (iVar6 < iVar5) {
      __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x354,
                    "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                   );
    }
    data_index = data_index - increment * iVar5;
    indx = iVar5 * 6 + indx;
  }
  right[5] = 0.0;
  while( true ) {
    if (data_index < 0) {
      iVar5 = (iVar4 - (increment - start_filter_index)) / increment;
      data_index = (increment - start_filter_index) + iVar5 * increment;
      indx = filter->b_current + channels * (iVar5 + 1);
      right[4] = 0.0;
      right[3] = 0.0;
      right[2] = 0.0;
      right[1] = 0.0;
      right[0] = 0.0;
      while( true ) {
        dVar7 = fp_to_double(data_index);
        iVar5 = fp_to_int(data_index);
        if ((iVar5 < 0) || (filter->coeff_half_len + 2 <= iVar5 + 1)) {
          __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x371,
                        "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                       );
        }
        fVar1 = filter->coeffs[iVar5];
        fVar2 = filter->coeffs[iVar5 + 1];
        fVar3 = filter->coeffs[iVar5];
        if ((indx < 0) || (filter->b_len <= indx + 5)) break;
        if (filter->b_end <= indx + 5) {
          __assert_fail("data_index + 5 < filter->b_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x374,
                        "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                       );
        }
        for (local_c0 = 0; local_c0 < 6; local_c0 = local_c0 + 1) {
          right[(long)local_c0 + -1] =
               (dVar7 * (double)(fVar2 - fVar3) + (double)fVar1) *
               (double)filter->buffer[indx + local_c0] + right[(long)local_c0 + -1];
        }
        data_index = data_index - increment;
        indx = indx + -6;
        if (data_index < 1) {
          for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
            output[local_c4] =
                 (float)(scale * (right[(long)local_c4 + 5] + right[(long)local_c4 + -1]));
          }
          return;
        }
      }
      __assert_fail("data_index >= 0 && data_index + 5 < filter->b_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x373,
                    "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                   );
    }
    dVar7 = fp_to_double(data_index);
    iVar5 = fp_to_int(data_index);
    if ((iVar5 < 0) || (filter->coeff_half_len + 2 <= iVar5 + 1)) {
      __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x35c,
                    "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                   );
    }
    fVar1 = filter->coeffs[iVar5];
    fVar2 = filter->coeffs[iVar5 + 1];
    fVar3 = filter->coeffs[iVar5];
    if ((indx < 0) || (filter->b_len <= indx + 5)) break;
    if (filter->b_end <= indx + 5) {
      __assert_fail("data_index + 5 < filter->b_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x35f,
                    "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                   );
    }
    for (ch_2 = 0; ch_2 < 6; ch_2 = ch_2 + 1) {
      right[(long)ch_2 + 5] =
           (dVar7 * (double)(fVar2 - fVar3) + (double)fVar1) * (double)filter->buffer[indx + ch_2] +
           right[(long)ch_2 + 5];
    }
    data_index = data_index - increment;
    indx = indx + 6;
  }
  __assert_fail("data_index >= 0 && data_index + 5 < filter->b_len",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                ,0x35e,
                "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
               );
}

Assistant:

static inline void
calc_output_hex (SINC_FILTER *filter, int channels, increment_t increment, increment_t start_filter_index, double scale, float * output)
{	double		fraction, left [6], right [6], icoeff ;
	increment_t	filter_index, max_filter_index ;
	int			data_index, coeff_count, indx ;

	/* Convert input parameters into fixed point. */
	max_filter_index = int_to_fp (filter->coeff_half_len) ;

	/* First apply the left half of the filter. */
	filter_index = start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current - channels * coeff_count ;

	if (data_index < 0) /* Avoid underflow access to filter->buffer. */
	{	int steps = int_div_ceil (-data_index, 6) ;
		/* If the assert triggers we would have to take care not to underflow/overflow */
		assert (steps <= int_div_ceil (filter_index, increment)) ;
		filter_index -= increment * steps ;
		data_index += steps * 6;
	}
	left [0] = left [1] = left [2] = left [3] = left [4] = left [5] = 0.0 ;
	while (filter_index >= MAKE_INCREMENT_T (0))
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;
		assert (indx >= 0 && indx + 1 < filter->coeff_half_len + 2) ;
		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;
		assert (data_index >= 0 && data_index + 5 < filter->b_len) ;
		assert (data_index + 5 < filter->b_end) ;
		for (int ch = 0; ch < 6; ch++)
			left [ch] += icoeff * filter->buffer [data_index + ch] ;

		filter_index -= increment ;
		data_index = data_index + 6 ;
		} ;

	/* Now apply the right half of the filter. */
	filter_index = increment - start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current + channels * (1 + coeff_count) ;

	right [0] = right [1] = right [2] = right [3] = right [4] = right [5] = 0.0 ;
	do
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;
		assert (indx >= 0 && indx + 1 < filter->coeff_half_len + 2) ;
		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;
		assert (data_index >= 0 && data_index + 5 < filter->b_len) ;
		assert (data_index + 5 < filter->b_end) ;
		for (int ch = 0; ch < 6; ch++)
			right [ch] += icoeff * filter->buffer [data_index + ch] ;

		filter_index -= increment ;
		data_index = data_index - 6 ;
		}
	while (filter_index > MAKE_INCREMENT_T (0)) ;

	for (int ch = 0; ch < 6; ch++)
		output [ch] = (float) (scale * (left [ch] + right [ch])) ;
}